

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<MakefileGenerator::Compiler>::moveAppend
          (QGenericArrayOps<MakefileGenerator::Compiler> *this,Compiler *b,Compiler *e)

{
  Compiler *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Compiler *in_RDI;
  Compiler *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<MakefileGenerator::Compiler>::begin
                        ((QArrayDataPointer<MakefileGenerator::Compiler> *)0x1b5387);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      MakefileGenerator::Compiler::Compiler(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->variable_in).d.size = (in_RDI->variable_in).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }